

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_strategies.cpp
# Opt level: O0

RestartSchedule
Clasp::RestartSchedule::dynamic
          (uint32 base,float k,uint32 lim,AvgType fast,Keep keep,AvgType slow,uint32 slowW)

{
  ScheduleStrategy SVar1;
  uint *puVar2;
  uint in_ECX;
  uint in_EDX;
  undefined4 in_ESI;
  uint in_EDI;
  int in_R8D;
  float in_XMM0_Da;
  RestartSchedule sched;
  uint local_30;
  uint local_2c;
  int local_28;
  uint local_24;
  uint local_20;
  undefined4 local_1c;
  float local_18;
  uint local_14;
  uint local_10;
  undefined4 local_8;
  float fStack_4;
  
  local_28 = in_R8D;
  local_24 = in_ECX;
  local_20 = in_EDX;
  local_1c = in_ESI;
  local_18 = in_XMM0_Da;
  local_14 = in_EDI;
  RestartSchedule((RestartSchedule *)0x2016be);
  local_10 = local_10 & 0xc0000000 | local_14 & 0x3fffffff | 0xc0000000;
  fStack_4 = local_18;
  local_8 = local_1c;
  local_30 = 0xffffff;
  puVar2 = std::min<unsigned_int>(&local_2c,&local_30);
  SVar1.idx = local_20 | local_28 << 3 | (local_24 & 3) << 6 | *puVar2 << 8;
  SVar1._0_4_ = local_10;
  SVar1.len = local_8;
  SVar1.grow = fStack_4;
  return (RestartSchedule)SVar1;
}

Assistant:

RestartSchedule RestartSchedule::dynamic(uint32 base, float k, uint32 lim, AvgType fast, Keep keep, AvgType slow, uint32 slowW) {
	RestartSchedule sched;
	sched.base = base;
	sched.type = 3u;
	sched.grow = k;
	sched.len  = lim;
	sched.idx  = uint32(fast) | (uint32(slow) << 3u) | ((keep & 3u) << 6u) | (std::min(slowW, (1u<<24)-1) << 8u);
	return sched;
}